

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O0

Section * __thiscall asmjit::v1_14::CodeHolder::ensureAddressTableSection(CodeHolder *this)

{
  undefined1 *in_RDI;
  size_t unaff_retaddr;
  char *in_stack_00000008;
  Section **in_stack_00000010;
  CodeHolder *in_stack_00000018;
  int32_t in_stack_00000060;
  Section *local_18;
  uint32_t in_stack_fffffffffffffff8;
  undefined2 in_stack_fffffffffffffffc;
  SectionFlags flags;
  
  if (*(long *)(in_RDI + 0x148) == 0) {
    flags = CONCAT13(*in_RDI,CONCAT12(*in_RDI,in_stack_fffffffffffffffc));
    std::numeric_limits<int>::max();
    newSection(in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,flags,
               in_stack_fffffffffffffff8,in_stack_00000060);
    local_18 = *(Section **)(in_RDI + 0x148);
  }
  else {
    local_18 = *(Section **)(in_RDI + 0x148);
  }
  return local_18;
}

Assistant:

Section* CodeHolder::ensureAddressTableSection() noexcept {
  if (_addressTableSection)
    return _addressTableSection;

  newSection(&_addressTableSection,
             CodeHolder_addrTabName,
             sizeof(CodeHolder_addrTabName) - 1,
             SectionFlags::kNone,
             _environment.registerSize(),
             std::numeric_limits<int32_t>::max());
  return _addressTableSection;
}